

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O3

bool __thiscall ON_Quaternion::GetRotation(ON_Quaternion *this,double *angle,ON_3dVector *axis)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  
  dVar1 = Length(this);
  dVar2 = 0.0;
  if (2.2250738585072014e-308 < dVar1) {
    dVar2 = acos(this->a / dVar1);
    dVar2 = dVar2 + dVar2;
  }
  *angle = dVar2;
  dVar2 = this->c;
  axis->x = this->b;
  axis->y = dVar2;
  axis->z = this->d;
  bVar3 = ON_3dVector::Unitize(axis);
  return bVar3 && 2.2250738585072014e-308 < dVar1;
}

Assistant:

bool ON_Quaternion::GetRotation(double& angle, ON_3dVector& axis) const
{
  const double s = Length();
  angle = (s > ON_DBL_MIN) ? 2.0*acos(a/s) : 0.0;
  axis.x = b;
  axis.y = c;
  axis.z = d;
  return (axis.Unitize() && s > ON_DBL_MIN);
}